

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O0

void __thiscall icu_63::RBBITableBuilder::flagLookAheadStates(RBBITableBuilder *this)

{
  UBool UVar1;
  int32_t iVar2;
  void *obj;
  void *pvVar3;
  RBBIStateDescriptor *sd;
  int32_t local_48;
  int32_t local_44;
  int32_t n;
  int32_t i;
  RBBINode *lookAheadNode;
  UVector lookAheadNodes;
  RBBITableBuilder *this_local;
  
  lookAheadNodes.comparer = (UElementsAreEqual *)this;
  UVar1 = ::U_FAILURE(*this->fStatus);
  if (UVar1 == '\0') {
    UVector::UVector((UVector *)&lookAheadNode,this->fStatus);
    RBBINode::findNodes(*this->fTree,(UVector *)&lookAheadNode,lookAhead,this->fStatus);
    UVar1 = ::U_FAILURE(*this->fStatus);
    if (UVar1 == '\0') {
      for (local_44 = 0; iVar2 = UVector::size((UVector *)&lookAheadNode), local_44 < iVar2;
          local_44 = local_44 + 1) {
        obj = UVector::elementAt((UVector *)&lookAheadNode,local_44);
        for (local_48 = 0; iVar2 = UVector::size(this->fDStates), local_48 < iVar2;
            local_48 = local_48 + 1) {
          pvVar3 = UVector::elementAt(this->fDStates,local_48);
          iVar2 = UVector::indexOf(*(UVector **)((long)pvVar3 + 0x20),obj,0);
          if (-1 < iVar2) {
            *(undefined4 *)((long)pvVar3 + 8) = *(undefined4 *)((long)obj + 0x7c);
          }
        }
      }
    }
    UVector::~UVector((UVector *)&lookAheadNode);
  }
  return;
}

Assistant:

void     RBBITableBuilder::flagLookAheadStates() {
    if (U_FAILURE(*fStatus)) {
        return;
    }
    UVector     lookAheadNodes(*fStatus);
    RBBINode    *lookAheadNode;
    int32_t     i;
    int32_t     n;

    fTree->findNodes(&lookAheadNodes, RBBINode::lookAhead, *fStatus);
    if (U_FAILURE(*fStatus)) {
        return;
    }
    for (i=0; i<lookAheadNodes.size(); i++) {
        lookAheadNode = (RBBINode *)lookAheadNodes.elementAt(i);

        for (n=0; n<fDStates->size(); n++) {
            RBBIStateDescriptor *sd = (RBBIStateDescriptor *)fDStates->elementAt(n);
            if (sd->fPositions->indexOf(lookAheadNode) >= 0) {
                sd->fLookAhead = lookAheadNode->fVal;
            }
        }
    }
}